

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::anon_unknown_58::Register(ExtensionInfo *info)

{
  char *pcVar1;
  ctrl_t *pcVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  MessageLite *pMVar5;
  uint uVar6;
  ushort uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ctrl_t cVar13;
  EnumValidityFuncWithArg *pEVar14;
  void *pvVar15;
  LazyEagerVerifyFnType p_Var16;
  undefined1 auVar17 [16];
  bool bVar18;
  FieldType FVar19;
  LazyAnnotation LVar20;
  char cVar21;
  int iVar22;
  long lVar23;
  reference key;
  undefined8 uVar24;
  LogMessage *this;
  flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *pfVar25;
  uint uVar26;
  uint64_t v;
  undefined1 uVar27;
  ctrl_t *unaff_RBP;
  ushort uVar28;
  ulong uVar29;
  uint64_t v_4;
  long lVar30;
  anon_union_8_1_a8a14541_for_iterator_2 in_R9;
  ctrl_t *in_R11;
  ulong uVar31;
  anon_union_8_1_a8a14541_for_iterator_2 aVar32;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  undefined4 uVar37;
  __m128i match_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar46 [16];
  __m128i match;
  undefined1 auVar50 [16];
  FindInfo FVar51;
  ulong local_a0;
  undefined1 local_88 [16];
  const_iterator local_70;
  GetTypeNameReturnType local_60;
  const_iterator local_40;
  char cVar42;
  char cVar43;
  char cVar44;
  ctrl_t cVar45;
  ctrl_t cVar47;
  ctrl_t cVar48;
  ctrl_t cVar49;
  
  if (((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
       local_static_registry == '\0') &&
     (iVar22 = __cxa_guard_acquire(&(anonymous_namespace)::
                                    Register(google::protobuf::internal::ExtensionInfo_const&)::
                                    local_static_registry), iVar22 != 0)) {
    pfVar25 = (flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               *)operator_new(0x20);
    (pfVar25->
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0;
    (pfVar25->
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    (pfVar25->
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.control =
         (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    OnShutdownRun(OnShutdownDelete<absl::lts_20240722::flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                  ::anon_class_1_0_00000001::__invoke,pfVar25);
    Register::local_static_registry = pfVar25;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::internal::ExtensionInfo_const&)::
                         local_static_registry);
  }
  pfVar25 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertHashEqConsistent<google::protobuf::internal::ExtensionInfo>
            (&Register::local_static_registry->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,info);
  aVar32 = (anon_union_8_1_a8a14541_for_iterator_2)
           (pfVar25->
           super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + (long)info->message;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)&info->message->_vptr_MessageLite +
                 (SUB168(auVar38 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar38 * ZEXT816(0x9ddfea08eb382d69),8));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)(uint)info->number;
  uVar3 = (pfVar25->
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if ((uVar3 + 1 & uVar3) == 0) {
    uVar31 = SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0);
    uVar34 = (uVar31 >> 7 ^ (ulong)aVar32.slot_ >> 0xc) & uVar3;
    auVar38 = ZEXT216(CONCAT11((char)uVar31,(char)uVar31) & 0x7f7f);
    auVar38 = pshuflw(auVar38,auVar38,0);
    uVar37 = auVar38._0_4_;
    auVar50._4_4_ = uVar37;
    auVar50._0_4_ = uVar37;
    auVar50._8_4_ = uVar37;
    auVar50._12_4_ = uVar37;
    local_a0 = 0;
    do {
      pcVar1 = (char *)((long)&(aVar32.slot_)->message + uVar34);
      cVar21 = auVar38[0];
      auVar40[0] = -(cVar21 == *pcVar1);
      cVar42 = auVar38[1];
      auVar40[1] = -(cVar42 == pcVar1[1]);
      cVar43 = auVar38[2];
      auVar40[2] = -(cVar43 == pcVar1[2]);
      cVar44 = auVar38[3];
      auVar40[3] = -(cVar44 == pcVar1[3]);
      auVar40[4] = -(cVar21 == pcVar1[4]);
      auVar40[5] = -(cVar42 == pcVar1[5]);
      auVar40[6] = -(cVar43 == pcVar1[6]);
      auVar40[7] = -(cVar44 == pcVar1[7]);
      auVar40[8] = -(cVar21 == pcVar1[8]);
      auVar40[9] = -(cVar42 == pcVar1[9]);
      auVar40[10] = -(cVar43 == pcVar1[10]);
      auVar40[0xb] = -(cVar44 == pcVar1[0xb]);
      auVar40[0xc] = -(cVar21 == pcVar1[0xc]);
      auVar40[0xd] = -(cVar42 == pcVar1[0xd]);
      auVar40[0xe] = -(cVar43 == pcVar1[0xe]);
      auVar40[0xf] = -(cVar44 == pcVar1[0xf]);
      uVar28 = (ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe | (ushort)(auVar40[0xf] >> 7) << 0xf;
      uVar26 = (uint)uVar28;
      if (uVar28 != 0) {
        lVar23 = *(long *)((long)&(pfVar25->
                                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                                  ).settings_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                  .value.heap_or_soo_ + 8);
        do {
          uVar33 = 0;
          if (uVar26 != 0) {
            for (; (uVar26 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
            }
          }
          uVar29 = uVar33 + uVar34 & uVar3;
          lVar30 = uVar29 * 0x30;
          if ((*(MessageLite **)(lVar23 + lVar30) == info->message) &&
             (*(int *)(lVar23 + 8 + lVar30) == info->number)) {
            pcVar4 = (pfVar25->
                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                     ).settings_.
                     super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_.heap.control;
            if (pcVar4 == (ctrl_t *)0x0) goto LAB_00136703;
            in_R9.slot_ = (slot_type *)(lVar23 + lVar30);
            unaff_RBP = pcVar4 + uVar29;
            bVar18 = false;
            goto LAB_0013649a;
          }
          uVar28 = (ushort)(uVar26 - 1) & (ushort)uVar26;
          uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar28);
        } while (uVar28 != 0);
      }
      auVar39[0] = -(*pcVar1 == -0x80);
      auVar39[1] = -(pcVar1[1] == -0x80);
      auVar39[2] = -(pcVar1[2] == -0x80);
      auVar39[3] = -(pcVar1[3] == -0x80);
      auVar39[4] = -(pcVar1[4] == -0x80);
      auVar39[5] = -(pcVar1[5] == -0x80);
      auVar39[6] = -(pcVar1[6] == -0x80);
      auVar39[7] = -(pcVar1[7] == -0x80);
      auVar39[8] = -(pcVar1[8] == -0x80);
      auVar39[9] = -(pcVar1[9] == -0x80);
      auVar39[10] = -(pcVar1[10] == -0x80);
      auVar39[0xb] = -(pcVar1[0xb] == -0x80);
      auVar39[0xc] = -(pcVar1[0xc] == -0x80);
      auVar39[0xd] = -(pcVar1[0xd] == -0x80);
      auVar39[0xe] = -(pcVar1[0xe] == -0x80);
      auVar39[0xf] = -(pcVar1[0xf] == -0x80);
      uVar28 = (ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe | (ushort)(auVar39[0xf] >> 7) << 0xf;
      if (uVar28 == 0) {
        if ((pfVar25->
            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            ).settings_.
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            capacity_ < local_a0 + 0x10) {
          __assert_fail("seq.index() <= capacity() && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xef5,
                        "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                       );
        }
        uVar34 = uVar34 + local_a0 + 0x10 & uVar3;
        local_a0 = local_a0 + 0x10;
      }
      else {
        cVar21 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                           ((pfVar25->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                            ).settings_.
                            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_,uVar31,
                            (pfVar25->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                            ).settings_.
                            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                            .value.heap_or_soo_.heap.control);
        if (cVar21 == '\0') {
          uVar26 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
            }
          }
        }
        else {
          uVar7 = 0xf;
          if (uVar28 != 0) {
            for (; uVar28 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar26 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
        }
        FVar51.offset = uVar26 + uVar34 & uVar3;
        FVar51.probe_length = local_a0;
        lVar23 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                           ((CommonFields *)pfVar25,uVar31,FVar51,
                            (PolicyFunctions *)
                            absl::lts_20240722::container_internal::
                            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
                            ::GetPolicyFunctions()::value);
        pcVar4 = (pfVar25->
                 super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                 ).settings_.
                 super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
        if (pcVar4 == (ctrl_t *)0x0) {
LAB_00136703:
          __assert_fail("ctrl != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x9c4,
                        "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                       );
        }
        unaff_RBP = pcVar4 + lVar23;
        in_R9.slot_ = (slot_type *)
                      (lVar23 * 0x30 +
                      (long)(pfVar25->
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                            ).settings_.
                            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                            .value.heap_or_soo_.heap.slot_array.p);
        local_88 = auVar50;
      }
    } while (uVar28 == 0);
    bVar18 = true;
LAB_0013649a:
    if (bVar18) {
      pMVar5 = info->message;
      iVar22 = info->number;
      FVar19 = info->type;
      bVar35 = info->is_repeated;
      bVar36 = info->is_packed;
      LVar20 = info->is_lazy;
      pEVar14 = (info->field_6).enum_validity_check.func;
      pvVar15 = (info->field_6).enum_validity_check.arg;
      p_Var16 = info->lazy_eager_verify_func;
      (in_R9.slot_)->descriptor = info->descriptor;
      (in_R9.slot_)->lazy_eager_verify_func = p_Var16;
      ((in_R9.slot_)->field_6).enum_validity_check.func = pEVar14;
      ((in_R9.slot_)->field_6).enum_validity_check.arg = pvVar15;
      (in_R9.slot_)->message = pMVar5;
      *(int *)((long)in_R9 + 8) = iVar22;
      *(FieldType *)((long)in_R9 + 0xc) = FVar19;
      *(bool *)((long)in_R9 + 0xd) = bVar35;
      *(bool *)((long)in_R9 + 0xe) = bVar36;
      *(LazyAnnotation *)((long)in_R9 + 0xf) = LVar20;
      local_60._M_dataplus._M_p = unaff_RBP;
      local_60._M_string_length = (size_type)in_R9;
      key = absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
            ::iterator::operator*((iterator *)&local_60);
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ::AssertHashEqConsistent<google::protobuf::internal::ExtensionInfo>
                (&pfVar25->
                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                 ,key);
      pcVar4 = (pfVar25->
               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      uVar3 = (pfVar25->
              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              ).settings_.
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
      if ((uVar3 + 1 & uVar3) != 0) goto LAB_00136722;
      pMVar5 = key->message;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (long)&absl::lts_20240722::hash_internal::MixingHashState::kSeed + (long)pMVar5;
      uVar26 = key->number;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (long)&pMVar5->_vptr_MessageLite +
           (SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),0) ^
           SUB168(auVar10 * ZEXT816(0x9ddfea08eb382d69),8));
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           (SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),0) ^
           SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)uVar26;
      uVar34 = SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0);
      uVar31 = (uVar34 >> 7 ^ (ulong)pcVar4 >> 0xc) & uVar3;
      uVar27 = (undefined1)uVar34;
      auVar38 = ZEXT216(CONCAT11(uVar27,uVar27) & 0x7f7f);
      auVar38 = pshuflw(auVar38,auVar38,0);
      lVar23 = *(long *)((long)&(pfVar25->
                                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                                ).settings_.
                                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                .
                                super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                .value.heap_or_soo_ + 8);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_88._8_8_;
      local_88 = auVar17 << 0x40;
      do {
        pcVar2 = pcVar4 + uVar31;
        cVar13 = pcVar2[0xf];
        cVar45 = auVar38[0];
        auVar46[0] = -(cVar45 == *pcVar2);
        cVar47 = auVar38[1];
        auVar46[1] = -(cVar47 == pcVar2[1]);
        cVar48 = auVar38[2];
        auVar46[2] = -(cVar48 == pcVar2[2]);
        cVar49 = auVar38[3];
        auVar46[3] = -(cVar49 == pcVar2[3]);
        auVar46[4] = -(cVar45 == pcVar2[4]);
        auVar46[5] = -(cVar47 == pcVar2[5]);
        auVar46[6] = -(cVar48 == pcVar2[6]);
        auVar46[7] = -(cVar49 == pcVar2[7]);
        auVar46[8] = -(cVar45 == pcVar2[8]);
        auVar46[9] = -(cVar47 == pcVar2[9]);
        auVar46[10] = -(cVar48 == pcVar2[10]);
        auVar46[0xb] = -(cVar49 == pcVar2[0xb]);
        auVar46[0xc] = -(cVar45 == pcVar2[0xc]);
        auVar46[0xd] = -(cVar47 == pcVar2[0xd]);
        auVar46[0xe] = -(cVar48 == pcVar2[0xe]);
        auVar46[0xf] = -(cVar49 == cVar13);
        uVar28 = (ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe | (ushort)(auVar46[0xf] >> 7) << 0xf
        ;
        uVar33 = (uint)uVar28;
        while (uVar28 != 0) {
          uVar6 = 0;
          if (uVar33 != 0) {
            for (; (uVar33 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar34 = uVar6 + uVar31 & uVar3;
          lVar30 = uVar34 * 0x30;
          bVar35 = *(MessageLite **)(lVar23 + lVar30) == pMVar5;
          bVar36 = *(uint *)(lVar23 + 8 + lVar30) == uVar26;
          if (bVar36 && bVar35) {
            if (pcVar4 == (ctrl_t *)0x0) goto LAB_00136703;
            aVar32.slot_ = (slot_type *)(lVar30 + lVar23);
            in_R11 = pcVar4 + uVar34;
          }
          if (bVar36 && bVar35) break;
          uVar28 = (ushort)(uVar33 - 1) & (ushort)uVar33;
          uVar33 = CONCAT22((short)(uVar33 - 1 >> 0x10),uVar28);
        }
        if (uVar28 != 0) {
LAB_001365f0:
          bVar35 = false;
        }
        else {
          auVar41[0] = -(*pcVar2 == kEmpty);
          auVar41[1] = -(pcVar2[1] == kEmpty);
          auVar41[2] = -(pcVar2[2] == kEmpty);
          auVar41[3] = -(pcVar2[3] == kEmpty);
          auVar41[4] = -(pcVar2[4] == kEmpty);
          auVar41[5] = -(pcVar2[5] == kEmpty);
          auVar41[6] = -(pcVar2[6] == kEmpty);
          auVar41[7] = -(pcVar2[7] == kEmpty);
          auVar41[8] = -(pcVar2[8] == kEmpty);
          auVar41[9] = -(pcVar2[9] == kEmpty);
          auVar41[10] = -(pcVar2[10] == kEmpty);
          auVar41[0xb] = -(pcVar2[0xb] == kEmpty);
          auVar41[0xc] = -(pcVar2[0xc] == kEmpty);
          auVar41[0xd] = -(pcVar2[0xd] == kEmpty);
          auVar41[0xe] = -(pcVar2[0xe] == kEmpty);
          auVar41[0xf] = -(cVar13 == kEmpty);
          if ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar41 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar41 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar41 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar41 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar41 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar41 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              cVar13 == kEmpty) {
            in_R11 = (ctrl_t *)0x0;
            goto LAB_001365f0;
          }
          if (uVar3 < local_88._0_8_ + 0x10) {
            __assert_fail("seq.index() <= capacity() && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xdbd,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                         );
          }
          uVar31 = uVar31 + local_88._0_8_ + 0x10 & uVar3;
          bVar35 = true;
          local_88._0_8_ = local_88._0_8_ + 0x10;
        }
      } while (bVar35);
      local_70.inner_.ctrl_ = in_R11;
      local_70.inner_.field_1 = aVar32;
      local_40.inner_.ctrl_ = unaff_RBP;
      local_40.inner_.field_1 = in_R9;
      bVar35 = absl::lts_20240722::container_internal::operator==(&local_70,&local_40);
      if (!bVar35) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf3f,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, Args = <const google::protobuf::internal::ExtensionInfo &>]"
                     );
      }
      if (bVar18) {
        return;
      }
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x5e);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              ((LogMessageFatal *)&local_70,0x2b,"Multiple extension registrations for type \"");
    MessageLite::GetTypeName_abi_cxx11_(&local_60,info->message);
    uVar24 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       ((LogMessage *)&local_70,(string *)&local_60);
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (uVar24,0x10,"\", field number ");
    local_40.inner_.ctrl_ = (ctrl_t *)CONCAT44(local_40.inner_.ctrl_._4_4_,info->number);
    this = (LogMessage *)
           _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                     (uVar24);
    absl::lts_20240722::log_internal::LogMessage::operator<<(this,(char (*) [2])0x18c14b);
    std::__cxx11::string::~string((string *)&local_60);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_70);
  }
LAB_00136722:
  __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x145,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!local_static_registry->insert(info).second) {
    ABSL_LOG(FATAL) << "Multiple extension registrations for type \""
                    << info.message->GetTypeName() << "\", field number "
                    << info.number << ".";
  }
}